

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

void __thiscall Log::Log(Log *this,string *_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  sem_t *__sem;
  undefined8 extraout_RAX;
  Log *this_00;
  
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + _name->_M_string_length);
  iVar3 = open((this->name)._M_dataplus._M_p,0x442,0x1a4);
  this->fd = iVar3;
  this_00 = (Log *)0x0;
  __sem = (sem_t *)mmap((void *)0x0,0x20,3,0x21,-1,0);
  if (__sem != (sem_t *)0xffffffffffffffff) {
    this->sem = (sem_t *)__sem;
    sem_init(__sem,1,1);
    return;
  }
  Log(this_00);
  pcVar2 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Log::Log(const std::string &_name):name(_name) {
    //打开用于记录日志的文件
    fd = open(name.c_str(), O_RDWR | O_CREAT | O_APPEND, 0644);
    //在mmap上创建信号量用于进行文件的写操作，防止时序竞态
    void *p = mmap(nullptr, sizeof(sem_t), PROT_READ | PROT_WRITE, MAP_SHARED | MAP_ANON, -1, 0);;
    if (p == MAP_FAILED) {
        perror("mmap error");
        exit(1);
    }
    sem = reinterpret_cast<sem_t *>(p);
    sem_init(sem, PTHREAD_PROCESS_SHARED, 1);  //互斥量
}